

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.cpp
# Opt level: O0

void __thiscall
CHeap::updateheap_unsafe(CHeap *this,AbstractSearchState *AbstractSearchState,CKey *NewKey)

{
  bool bVar1;
  CKey *in_RDX;
  long in_RSI;
  CKey *in_RDI;
  char *in_stack_ffffffffffffffd0;
  CKey local_28;
  long local_10;
  
  local_10 = in_RSI;
  if (*(int *)(in_RSI + 0x10) == 0) {
    heaperror(in_stack_ffffffffffffffd0);
  }
  bVar1 = CKey::operator!=(in_RDI,in_RDX);
  if (bVar1) {
    local_28.key[0] = in_RDX->key[0];
    local_28.key[1] = in_RDX->key[1];
    CKey::operator=((CKey *)(in_RDI->key[1] + 8 + (long)*(int *)(local_10 + 0x10) * 0x18),&local_28)
    ;
    CKey::~CKey(&local_28);
  }
  return;
}

Assistant:

void CHeap::updateheap_unsafe(AbstractSearchState* AbstractSearchState, CKey NewKey)
{
    if (AbstractSearchState->heapindex == 0) {
        heaperror("updateheap: AbstractSearchState is not in heap");
    }
    if (heap[AbstractSearchState->heapindex].key != NewKey) {
        heap[AbstractSearchState->heapindex].key = NewKey;
    }
}